

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O0

int * Hash_Int2ManLookup(Hash_IntMan_t *p,int iData0,int iData1)

{
  Vec_Int_t *p_00;
  int iVar1;
  Hash_IntObj_t *pHVar2;
  int *local_30;
  int *pPlace;
  Hash_IntObj_t *pObj;
  int iData1_local;
  int iData0_local;
  Hash_IntMan_t *p_local;
  
  p_00 = p->vTable;
  iVar1 = Vec_IntSize(p->vTable);
  iVar1 = Hash_Int2ManHash(iData0,iData1,iVar1);
  local_30 = Vec_IntEntryP(p_00,iVar1);
  while( true ) {
    pHVar2 = Hash_IntObj(p,*local_30);
    if (pHVar2 == (Hash_IntObj_t *)0x0) {
      if (*local_30 == 0) {
        return local_30;
      }
      __assert_fail("*pPlace == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHash.h"
                    ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
    }
    if ((pHVar2->iData0 == iData0) && (pHVar2->iData1 == iData1)) break;
    local_30 = &pHVar2->iNext;
  }
  return local_30;
}

Assistant:

static inline int * Hash_Int2ManLookup( Hash_IntMan_t * p, int iData0, int iData1 )
{
    Hash_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hash_Int2ManHash(iData0, iData1, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hash_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->iData0 == iData0 && pObj->iData1 == iData1 )
            return pPlace;
    assert( *pPlace == 0 );
    return pPlace;
}